

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_artist.cpp
# Opt level: O1

void __thiscall polyscope::VectorArtist::draw(VectorArtist *this)

{
  bool bVar1;
  float fVar2;
  undefined8 uVar3;
  element_type *peVar4;
  undefined1 *puVar5;
  vec4 vVar6;
  mat4 Pinv;
  mat4 P;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 local_a8 [64];
  mat<4,_4,_float,_(glm::qualifier)0> local_68;
  
  if ((this->program).
      super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    createProgram(this);
  }
  Structure::setTransformUniforms
            (this->parentStructure,
             (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"u_radius","");
  bVar1 = (this->vectorRadius).value.relativeFlag;
  fVar2 = (this->vectorRadius).value.value;
  (*peVar4->_vptr_ShaderProgram[5])
            ((ulong)((uint)(bVar1 & 1) * (int)(float)((double)fVar2 * state::lengthScale) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar2),peVar4,(string *)local_c8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"u_baseColor","");
  uVar3._0_4_ = (this->vectorColor).value.field_0;
  uVar3._4_4_ = (this->vectorColor).value.field_1;
  (*peVar4->_vptr_ShaderProgram[9])
            (uVar3,(ulong)(uint)(this->vectorColor).value.field_2,peVar4,(string *)local_e8);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this->vectorType == AMBIENT) {
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"u_lengthMult","");
    (*peVar4->_vptr_ShaderProgram[6])(0x3ff0000000000000,peVar4,(string *)local_108);
    puVar5 = local_108[0];
    if (local_108[0] == local_f8) goto LAB_00200017;
  }
  else {
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"u_lengthMult","");
    bVar1 = (this->vectorLengthMult).value.relativeFlag;
    fVar2 = (this->vectorLengthMult).value.value;
    (*peVar4->_vptr_ShaderProgram[6])
              ((double)(float)((uint)(bVar1 & 1) * (int)(float)((double)fVar2 * state::lengthScale)
                              + (uint)!(bool)(bVar1 & 1) * (int)fVar2) / this->maxLength,peVar4,
               (string *)local_128);
    puVar5 = local_128[0];
    if (local_128[0] == local_118) goto LAB_00200017;
  }
  operator_delete(puVar5);
LAB_00200017:
  view::getCameraPerspectiveMatrix();
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_68);
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"u_invProjMatrix","");
  (*peVar4->_vptr_ShaderProgram[7])(peVar4,local_148,local_a8);
  if (local_148[0] != local_138) {
    operator_delete(local_148[0]);
  }
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"u_viewport","");
  vVar6 = render::Engine::getCurrentViewport(render::engine);
  (*peVar4->_vptr_ShaderProgram[10])(vVar6._0_8_,vVar6._8_8_,peVar4,local_168);
  if (local_168[0] != local_158) {
    operator_delete(local_168[0]);
  }
  (*((this->program).
     super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ShaderProgram[0x1e])();
  return;
}

Assistant:

void VectorArtist::draw() {
  if (program == nullptr) {
    createProgram();
  }

  // Set uniforms
  parentStructure.setTransformUniforms(*program);

  program->setUniform("u_radius", vectorRadius.get().asAbsolute());
  program->setUniform("u_baseColor", vectorColor.get());

  if (vectorType == VectorType::AMBIENT) {
    program->setUniform("u_lengthMult", 1.0);
  } else {
    program->setUniform("u_lengthMult", vectorLengthMult.get().asAbsolute() / maxLength);
  }

  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  program->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  program->setUniform("u_viewport", render::engine->getCurrentViewport());

  program->draw();
}